

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::DeepScanLineOutputFile::Data::Data(Data *this,int numThreads)

{
  reference ppLVar1;
  long in_RDI;
  size_type sVar2;
  vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  *this_00;
  size_t i;
  DeepFrameBuffer *in_stack_ffffffffffffff90;
  long lVar3;
  undefined8 in_stack_ffffffffffffffc0;
  V2f *in_stack_ffffffffffffffc8;
  ulong uVar4;
  ulong __n;
  float in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  Header *in_stack_ffffffffffffffe0;
  Vec2<float> local_14 [2];
  
  lVar3 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(local_14,0.0,0.0);
  Header::Header(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                 in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                 (float)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                 (LineOrder)in_stack_ffffffffffffffc0,(Compression)((ulong)lVar3 >> 0x20));
  DeepFrameBuffer::DeepFrameBuffer(in_stack_ffffffffffffff90);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ad2b5);
  sVar2 = in_RDI + 0xe8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ad2cb);
  this_00 = (vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
             *)(in_RDI + 0x108);
  std::
  vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
  ::vector((vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
            *)0x1ad2e1);
  *(undefined8 *)(in_RDI + 0x120) = 0;
  std::
  vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ::vector((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
            *)0x1ad302);
  *(undefined4 *)(in_RDI + 0x144) = 0xffffffff;
  Array<unsigned_int>::Array((Array<unsigned_int> *)(in_RDI + 0x158));
  *(undefined8 *)(in_RDI + 0x170) = 0;
  *(undefined1 *)(in_RDI + 0x178) = 0;
  std::max<int>((int *)&stack0xffffffffffffffd8,(int *)&stack0xffffffffffffffd4);
  std::
  vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ::resize(this_00,sVar2);
  uVar4 = 0;
  while( true ) {
    __n = uVar4;
    sVar2 = std::
            vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
            ::size((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                    *)(in_RDI + 0x128));
    if (sVar2 <= uVar4) break;
    ppLVar1 = std::
              vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
              ::operator[]((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                            *)(in_RDI + 0x128),__n);
    *ppLVar1 = (value_type)0x0;
    uVar4 = __n + 1;
  }
  return;
}

Assistant:

DeepScanLineOutputFile::Data::Data (int numThreads)
    : lineOffsetsPosition (0)
    , partNumber (-1)
    , _streamData (NULL)
    , _deleteStream (false)
{
    //
    // We need at least one lineBuffer, but if threading is used,
    // to keep n threads busy we need 2*n lineBuffers.
    //

    lineBuffers.resize (max (1, 2 * numThreads));
    for (size_t i = 0; i < lineBuffers.size (); i++)
        lineBuffers[i] = 0;
}